

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O2

void __thiscall
CP::priority_queue<student,_std::less<student>_>::fixDown
          (priority_queue<student,_std::less<student>_> *this,size_t idx)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  student tmp;
  student local_60;
  
  student::student(&local_60,this->mData + idx);
  while( true ) {
    uVar1 = idx * 2 + 1;
    if (this->mSize <= uVar1) break;
    uVar3 = idx * 2 + 2;
    uVar4 = uVar1;
    if ((uVar3 < this->mSize) &&
       (bVar2 = student::operator<(this->mData + uVar1,this->mData + uVar3), uVar4 = uVar3, !bVar2))
    {
      uVar4 = uVar1;
    }
    bVar2 = student::operator<(this->mData + uVar4,&local_60);
    if (bVar2) break;
    student::operator=(this->mData + idx,this->mData + uVar4);
    idx = uVar4;
  }
  student::operator=(this->mData + idx,&local_60);
  student::~student(&local_60);
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }